

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extralev.c
# Opt level: O1

void miniwalk(int x,int y)

{
  byte *pbVar1;
  uint uVar2;
  uint uVar3;
  uchar *puVar4;
  byte bVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  int dirs [4];
  undefined4 local_38 [4];
  
  uVar7 = (ulong)(uint)y;
  do {
    uVar8 = 0;
    iVar6 = (int)uVar7;
    if ((0 < x) && ((*(byte *)((ulong)(uint)x * 0x24 + 0x327d15 + (long)iVar6 * 0xc) & 4) == 0)) {
      if (*(char *)((ulong)(x - 1) * 0x24 + 0x327d15 + (long)iVar6 * 0xc) != '\0') {
        uVar2 = mt_random();
        uVar8 = 0;
        if (0x19999999 < (uVar2 * -0x33333333 >> 1 | (uint)((uVar2 * -0x33333333 & 1) != 0) << 0x1f)
           ) goto LAB_0019df9f;
      }
      local_38[0] = 0;
      uVar8 = 1;
    }
LAB_0019df9f:
    uVar9 = uVar8;
    if (((x < 2) && ((*(byte *)((long)x * 0x24 + 0x327d15 + (long)iVar6 * 0xc) & 8) == 0)) &&
       ((*(char *)((long)(int)(x + 1) * 0x24 + 0x327d15 + (long)iVar6 * 0xc) == '\0' ||
        (uVar2 = mt_random(),
        (uVar2 * -0x33333333 >> 1 | (uint)((uVar2 * -0x33333333 & 1) != 0) << 0x1f) < 0x1999999a))))
    {
      uVar9 = (ulong)((int)uVar8 + 1);
      local_38[uVar8] = 1;
    }
    uVar8 = uVar9;
    if (((0 < iVar6) && ((*(byte *)((long)x * 0x24 + 0x327d15 + uVar7 * 0xc) & 1) == 0)) &&
       ((*(char *)((long)x * 0x24 + 0x327d15 + (ulong)(iVar6 - 1) * 0xc) == '\0' ||
        (uVar2 = mt_random(),
        (uVar2 * -0x33333333 >> 1 | (uint)((uVar2 * -0x33333333 & 1) != 0) << 0x1f) < 0x1999999a))))
    {
      uVar8 = (ulong)((int)uVar9 + 1);
      local_38[uVar9] = 2;
    }
    uVar2 = (uint)uVar8;
    if (((iVar6 < 2) && ((*(byte *)((long)x * 0x24 + 0x327d15 + (long)iVar6 * 0xc) & 2) == 0)) &&
       ((*(char *)((long)x * 0x24 + 0x327d15 + (long)(iVar6 + 1) * 0xc) == '\0' ||
        (uVar3 = mt_random(),
        (uVar3 * -0x33333333 >> 1 | (uint)((uVar3 * -0x33333333 & 1) != 0) << 0x1f) < 0x1999999a))))
    {
      uVar2 = uVar2 + 1;
      local_38[uVar8] = 3;
    }
    if (uVar2 == 0) {
      return;
    }
    uVar3 = mt_random();
    switch(local_38[(ulong)uVar3 % (ulong)uVar2]) {
    case 0:
      pbVar1 = (byte *)((long)x * 0x24 + 0x327d15 + (long)iVar6 * 0xc);
      *pbVar1 = *pbVar1 | 4;
      x = x - 1;
      puVar4 = &r[x][iVar6].doortable;
      bVar5 = 8;
      break;
    case 1:
      pbVar1 = (byte *)((long)x * 0x24 + 0x327d15 + (long)iVar6 * 0xc);
      *pbVar1 = *pbVar1 | 8;
      x = x + 1;
      puVar4 = &r[x][iVar6].doortable;
      bVar5 = 4;
      break;
    case 2:
      pbVar1 = (byte *)((long)x * 0x24 + 0x327d15 + (long)iVar6 * 0xc);
      *pbVar1 = *pbVar1 | 1;
      uVar7 = (ulong)(iVar6 - 1U);
      puVar4 = &r[x][(int)(iVar6 - 1U)].doortable;
      bVar5 = 2;
      break;
    case 3:
      pbVar1 = (byte *)((long)x * 0x24 + 0x327d15 + (long)iVar6 * 0xc);
      *pbVar1 = *pbVar1 | 2;
      uVar7 = (ulong)(iVar6 + 1U);
      puVar4 = &r[x][(int)(iVar6 + 1U)].doortable;
      bVar5 = 1;
      break;
    default:
      goto switchD_0019e0b6_default;
    }
    *puVar4 = *puVar4 | bVar5;
switchD_0019e0b6_default:
    miniwalk(x,(int)uVar7);
  } while( true );
}

Assistant:

static void miniwalk(int x, int y)
{
	int q, dir;
	int dirs[4];

	while (1) {
		q = 0;
#define doorhere (r[x][y].doortable)
		if (x>0 && (!(doorhere & LEFT)) &&
					(!r[x-1][y].doortable || !rn2(10)))
			dirs[q++] = 0;
		if (x<2 && (!(doorhere & RIGHT)) &&
					(!r[x+1][y].doortable || !rn2(10)))
			dirs[q++] = 1;
		if (y>0 && (!(doorhere & UP)) &&
					(!r[x][y-1].doortable || !rn2(10)))
			dirs[q++] = 2;
		if (y<2 && (!(doorhere & DOWN)) &&
					(!r[x][y+1].doortable || !rn2(10)))
			dirs[q++] = 3;
	/* Rogue levels aren't just 3 by 3 mazes; they have some extra
	 * connections, thus that 1/10 chance
	 */
		if (!q) return;
		dir = dirs[rn2(q)];
		switch(dir) { /* Move in direction */
			case 0: doorhere |= LEFT;
				x--;
				doorhere |= RIGHT;
				break;
			case 1: doorhere |= RIGHT;
				x++;
				doorhere |= LEFT;
				break;
			case 2: doorhere |= UP;
				y--;
				doorhere |= DOWN;
				break;
			case 3: doorhere |= DOWN;
				y++;
				doorhere |= UP;
				break;
		}
		miniwalk(x,y);
	}
}